

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

TValue * lj_meta_arith(lua_State *L,TValue *ra,cTValue *rb,cTValue *rc,BCReg op)

{
  StrScanFmt SVar1;
  cTValue *pcVar2;
  TValue *pTVar3;
  ulong uVar4;
  TValue *pTVar5;
  MMS mm;
  uint64_t uVar6;
  TValue tempb;
  TValue tempc;
  TValue local_40;
  TValue local_38;
  
  mm = (MMS)(lj_bc_mode[op] >> 0xb);
  pTVar3 = rb;
  if (0xfffefffe < (rb->field_2).it) {
    if ((rb->field_2).it != 0xfffffffb) goto LAB_0010b24d;
    pTVar3 = &local_40;
    SVar1 = lj_strscan_scan((uint8_t *)((ulong)(rb->u32).lo + 0x10),pTVar3,2);
    if (SVar1 == STRSCAN_ERROR) goto LAB_0010b24d;
  }
  pTVar5 = rc;
  if (0xfffefffe < (rc->field_2).it) {
    if ((rc->field_2).it == 0xfffffffb) {
      SVar1 = lj_strscan_scan((uint8_t *)((ulong)(rc->u32).lo + 0x10),&local_38,2);
      pTVar5 = &local_38;
      if (SVar1 != STRSCAN_ERROR) goto LAB_0010b22d;
    }
LAB_0010b24d:
    pcVar2 = lj_meta_lookup(L,rb,mm);
    if (((pcVar2->field_2).it == 0xffffffff) &&
       (pcVar2 = lj_meta_lookup(L,rc,mm), (pcVar2->field_2).it == 0xffffffff)) {
      pcVar2 = str2num(rb,&local_40);
      if (pcVar2 == (cTValue *)0x0) {
        rc = rb;
      }
      lj_err_optype(L,rc,LJ_ERR_OPARITH);
    }
    uVar4 = (ulong)L->base[-1].u32.lo;
    if (*(char *)(uVar4 + 6) == '\0') {
      pTVar3 = L->base + *(byte *)((ulong)*(uint *)(uVar4 + 0x10) - 0x39);
    }
    else {
      pTVar3 = L->top;
    }
    pTVar3->n = 3.57999966976567e-320;
    pTVar3[1] = *pcVar2;
    pTVar3[2] = *rb;
    pTVar3[3] = *rc;
    return pTVar3 + 2;
  }
LAB_0010b22d:
  uVar6 = lj_vm_foldarith(pTVar3->u64,pTVar5->u64,mm - MM_add);
  ra->u64 = uVar6;
  return (TValue *)0x0;
}

Assistant:

TValue *lj_meta_arith(lua_State *L, TValue *ra, cTValue *rb, cTValue *rc,
		      BCReg op)
{
  MMS mm = bcmode_mm(op);
  TValue tempb, tempc;
  cTValue *b, *c;
  if ((b = str2num(rb, &tempb)) != NULL &&
      (c = str2num(rc, &tempc)) != NULL) {  /* Try coercion first. */
    setnumV(ra, lj_vm_foldarith(numV(b), numV(c), (int)mm-MM_add));
    return NULL;
  } else {
    cTValue *mo = lj_meta_lookup(L, rb, mm);
    if (tvisnil(mo)) {
      mo = lj_meta_lookup(L, rc, mm);
      if (tvisnil(mo)) {
	if (str2num(rb, &tempb) == NULL) rc = rb;
	lj_err_optype(L, rc, LJ_ERR_OPARITH);
	return NULL;  /* unreachable */
      }
    }
    return mmcall(L, lj_cont_ra, mo, rb, rc);
  }
}